

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::load(Compiler *this,SchemaLoader *loader,uint64_t id)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_> *this_00;
  Maybe<capnp::compiler::Compiler::Node_&> this_01;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  this_01 = Impl::findNode((this->impl).value.ptr,id);
  if (this_01.ptr != (Node *)0x0) {
    Node::loadFinalSchema(this_01.ptr,loader);
  }
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  return;
}

Assistant:

void Compiler::load(const SchemaLoader& loader, uint64_t id) const {
  impl.lockExclusive()->get()->loadFinal(loader, id);
}